

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  stbi__context *psVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  stbi_uc *psVar7;
  stbi_uc sVar8;
  
  do {
    uVar6 = 0;
    if (j->nomore == 0) {
      psVar1 = j->s;
      pbVar2 = psVar1->img_buffer;
      if (pbVar2 < psVar1->img_buffer_end) {
        psVar1->img_buffer = pbVar2 + 1;
        bVar4 = *pbVar2;
      }
      else {
        uVar6 = 0;
        if (psVar1->read_from_callbacks == 0) goto LAB_0011fd77;
        psVar3 = psVar1->buffer_start;
        iVar5 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
        if (iVar5 == 0) {
          psVar1->read_from_callbacks = 0;
          psVar7 = psVar1->buffer_start + 1;
          psVar1->buffer_start[0] = '\0';
          bVar4 = 0;
        }
        else {
          psVar7 = psVar3 + iVar5;
          bVar4 = *psVar3;
        }
        psVar1->img_buffer_end = psVar7;
        psVar1->img_buffer = psVar1->buffer_start + 1;
      }
      if (bVar4 == 0xff) {
        psVar1 = j->s;
        psVar3 = psVar1->img_buffer;
        if (psVar3 < psVar1->img_buffer_end) {
          psVar1->img_buffer = psVar3 + 1;
          sVar8 = *psVar3;
        }
        else {
          if (psVar1->read_from_callbacks == 0) {
            uVar6 = 0xff;
            goto LAB_0011fd77;
          }
          psVar3 = psVar1->buffer_start;
          iVar5 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
          if (iVar5 == 0) {
            psVar1->read_from_callbacks = 0;
            psVar7 = psVar1->buffer_start + 1;
            psVar1->buffer_start[0] = '\0';
            sVar8 = '\0';
          }
          else {
            psVar7 = psVar3 + iVar5;
            sVar8 = *psVar3;
          }
          psVar1->img_buffer_end = psVar7;
          psVar1->img_buffer = psVar1->buffer_start + 1;
        }
        uVar6 = 0xff;
        if (sVar8 != '\0') {
          j->marker = sVar8;
          j->nomore = 1;
          return;
        }
      }
      else {
        uVar6 = (uint)bVar4;
      }
    }
LAB_0011fd77:
    iVar5 = j->code_bits;
    j->code_buffer = j->code_buffer | uVar6 << (0x18U - (char)iVar5 & 0x1f);
    j->code_bits = iVar5 + 8;
    if (0x10 < iVar5) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}